

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  GenericTypeHandler<google::protobuf::Message> *this_00;
  GenericTypeHandler<google::protobuf::Message> *from;
  Message *to;
  
  this_00 = (GenericTypeHandler<google::protobuf::Message> *)
            UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                      (this);
  from = this_00;
  if (this->arena_ != (Arena *)0x0) {
    from = (GenericTypeHandler<google::protobuf::Message> *)
           GenericTypeHandler<google::protobuf::Message>::NewFromPrototype
                     ((Message *)this_00,(Arena *)0x0);
    GenericTypeHandler<google::protobuf::Message>::Merge(this_00,(Message *)from,to);
  }
  return (Type *)from;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::ReleaseLastInternal(google::protobuf::internal::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArenaNoVirtual();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}